

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O3

loader_impl_data ext_loader_impl_initialize(loader_impl impl,configuration config)

{
  int iVar1;
  _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  *this;
  _Rb_tree_header *p_Var2;
  
  this = (_Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          *)operator_new(0x60);
  p_Var2 = &(this->_M_impl).super__Rb_tree_header;
  (this->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_M_impl).super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_M_impl).super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&this[1]._M_impl = 0;
  *(undefined8 *)&this[1]._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined8 *)&this->_M_impl = 0;
  *(undefined8 *)&(this->_M_impl).super__Rb_tree_header._M_header = 0;
  (this->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  p_Var2 = &this[1]._M_impl.super__Rb_tree_header;
  this[1]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  this[1]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this[1]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  this[1]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  this[1]._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = ext_loader_impl_initialize_types(impl);
  if (iVar1 == 0) {
    loader_initialization_register(impl);
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
                 *)(this + 1));
    std::
    _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
    ::~_Rb_tree(this);
    operator_delete(this,0x60);
    this = (_Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            *)0x0;
  }
  return this;
}

Assistant:

loader_impl_data ext_loader_impl_initialize(loader_impl impl, configuration config)
{
	loader_impl_ext ext_impl = new loader_impl_ext_type();

	(void)impl;
	(void)config;

	if (ext_impl == nullptr)
	{
		return NULL;
	}

	if (ext_loader_impl_initialize_types(impl) != 0)
	{
		delete ext_impl;

		return NULL;
	}

	/* Register initialization */
	loader_initialization_register(impl);

	return static_cast<loader_impl_data>(ext_impl);
}